

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                     ImGuiWindowClass *window_class)

{
  byte *pbVar1;
  uint uVar2;
  ImGuiWindow *this;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  undefined8 uVar5;
  ImGuiContext *ctx;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImGuiContext *g_1;
  ImGuiDockNode *node;
  uint uVar9;
  ImGuiContext *g;
  int iVar10;
  int iVar11;
  ImVec2 size;
  char title [256];
  
  ctx = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    if (((uint)flags >> 10 & 1) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x37d1,
                    "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x37d2,
                    "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    uVar9 = (uint)this->SkipItems | flags;
    node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,id);
    if (node == (ImGuiDockNode *)0x0) {
      node = DockContextAddNode(ctx,id);
      pbVar1 = (byte *)((long)&node->LocalFlags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    node->SharedFlags = uVar9;
    if (window_class == (ImGuiWindowClass *)0x0) {
      title[0x10] = '\0';
      title[0x11] = '\0';
      title[0x12] = '\0';
      title[0x13] = '\0';
      title[0x14] = '\0';
      title[0x15] = '\0';
      title[0x16] = '\0';
      title[0x17] = '\0';
      title[0x18] = '\0';
      title[0] = '\0';
      title[1] = '\0';
      title[2] = '\0';
      title[3] = '\0';
      title[4] = '\0';
      title[5] = '\0';
      title[6] = '\0';
      title[7] = '\0';
      title[8] = '\0';
      title[9] = '\0';
      title[10] = '\0';
      title[0xb] = '\0';
      title[0xc] = '\0';
      title[0xd] = '\0';
      title[0xe] = '\0';
      title[0xf] = '\0';
      bVar7 = true;
    }
    else {
      title._0_8_ = *(undefined8 *)window_class;
      uVar5._0_4_ = window_class->ViewportFlagsOverrideSet;
      uVar5._4_4_ = window_class->ViewportFlagsOverrideClear;
      title._17_8_ = *(undefined8 *)((long)&window_class->DockNodeFlagsOverrideSet + 1);
      title[0x10] = (char)((ulong)*(undefined8 *)((long)&window_class->ViewportFlagsOverrideSet + 1)
                          >> 0x38);
      title[8] = (char)(undefined4)uVar5;
      title._9_7_ = (undefined7)((ulong)uVar5 >> 8);
      bVar7 = window_class->DockingAllowUnclassed;
    }
    *(ulong *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 1) =
         CONCAT17(title[0x10],title._9_7_);
    *(undefined8 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 1) = title._17_8_;
    *(undefined8 *)&node->WindowClass = title._0_8_;
    (node->WindowClass).ViewportFlagsOverrideSet = (int)CONCAT71(title._9_7_,title[8]);
    (node->WindowClass).ViewportFlagsOverrideClear = SUB74(title._9_7_,3);
    (node->WindowClass).DockingAllowUnclassed = bVar7;
    uVar2 = node->LocalFlags;
    iVar10 = ctx->FrameCount;
    if (((uVar9 & 1) == 0) && (node->LastFrameActive == iVar10)) {
      if ((uVar2 >> 10 & 1) != 0) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x37e3,
                      "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      node->LocalFlags = uVar2 | 0x400;
    }
    else {
      node->LocalFlags = uVar2 | 0x400;
      if ((uVar9 & 1) == 0) {
        IVar4 = GetContentRegionAvail();
        iVar10 = (int)(*size_arg).x;
        iVar11 = (int)(*size_arg).y;
        size.x = (float)iVar10;
        size.y = (float)iVar11;
        if ((iVar10 < 1) && (size.x = IVar4.x + size.x, size.x <= 4.0)) {
          size.x = 4.0;
        }
        if ((iVar11 < 1) && (size.y = IVar4.y + size.y, size.y <= 4.0)) {
          size.y = 4.0;
        }
        if ((size.x <= 0.0) || (size.y <= 0.0)) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x37f6,
                        "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        node->Pos = (this->DC).CursorPos;
        node->SizeRef = size;
        node->Size = size;
        pIVar6 = GImGui;
        uVar9 = (GImGui->NextWindowData).Flags;
        (GImGui->NextWindowData).Flags = uVar9 | 1;
        (pIVar6->NextWindowData).PosVal = node->Pos;
        (pIVar6->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar6->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar6->NextWindowData).PosCond = 1;
        (pIVar6->NextWindowData).PosUndock = true;
        (pIVar6->NextWindowData).Flags = uVar9 | 3;
        (pIVar6->NextWindowData).SizeVal = node->Size;
        (pIVar6->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString(title,0x100,"%s/DockSpace_%08X",this->Name,id);
        if ((0 < (node->Windows).Size) || (node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PushStyleColor(3,0);
        }
        PushStyleVar(7,0.0);
        Begin(title,(bool *)0x0,0x2100013b);
        PopStyleVar(1);
        if ((0 < (node->Windows).Size) || (node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PopStyleColor(1);
        }
        pIVar3 = ctx->CurrentWindow;
        pIVar3->DockNodeAsHost = node;
        IVar8 = ImGuiWindow::GetID(this,title,(char *)0x0);
        pIVar3->ChildId = IVar8;
        node->HostWindow = pIVar3;
        node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        if (node->ParentNode != (ImGuiDockNode *)0x0) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3815,
                        "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        if ((node->ChildNodes[0] == (ImGuiDockNode *)0x0) &&
           (((uint)node->LocalFlags >> 0xb & 1) == 0)) {
          node->LocalFlags = node->LocalFlags | 0x800;
        }
        DockNodeUpdate(node);
        End();
        ItemSize(&size,-1.0);
      }
      else {
        node->LastFrameAlive = iVar10;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;
        return;
    }
    node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK Why do we need a child window to host a dockspace, could we host it in the existing window?
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    // FIXME-DOCK: What is the reason for not simply calling BeginChild()?
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PushStyleColor(ImGuiCol_ChildBg, IM_COL32(0, 0, 0, 0));
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PopStyleColor();

    ImGuiWindow* host_window = g.CurrentWindow;
    host_window->DockNodeAsHost = node;
    host_window->ChildId = window->GetID(title);
    node->HostWindow = host_window;
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
}